

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O0

UChar32 u_forDigit_63(int32_t digit,int8_t radix)

{
  int iStack_c;
  int8_t radix_local;
  int32_t digit_local;
  
  if (((byte)(radix - 2U) < 0x23) && ((uint)digit < (uint)(int)radix)) {
    if (digit < 10) {
      iStack_c = digit + 0x30;
    }
    else {
      iStack_c = digit + 0x57;
    }
  }
  else {
    iStack_c = 0;
  }
  return iStack_c;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
u_forDigit(int32_t digit, int8_t radix) {
    if((uint8_t)(radix-2)>(36-2) || (uint32_t)digit>=(uint32_t)radix) {
        return 0;
    } else if(digit<10) {
        return (UChar32)(0x30+digit);
    } else {
        return (UChar32)((0x61-10)+digit);
    }
}